

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O2

void __thiscall trun::TestRunner::PrepareTests(TestRunner *this)

{
  Log *this_00;
  char *arguments_1;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Base_ptr __str;
  _Base_ptr this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  Ref func;
  Ref tModule;
  string moduleName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> x;
  undefined1 local_d0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  undefined1 local_50 [32];
  
  this_00 = this->pLogger;
  iVar3 = (*((this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_IDynLibrary[6])();
  arguments_1 = *(char **)CONCAT44(extraout_var,iVar3);
  Version::AsString_abi_cxx11_
            (&local_70,
             &((this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->version);
  gnilk::Log::Info<char_const*,char_const*,char_const*>
            (this_00,"Prepare tests in library: %s (%s)",arguments_1,local_70._M_dataplus._M_p);
  local_a0 = (_Base_ptr)&this->library;
  std::__cxx11::string::~string((string *)&local_70);
  iVar3 = (*((this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_IDynLibrary[5])();
  __str = *(_Base_ptr *)CONCAT44(extraout_var_00,iVar3);
  local_98 = (_Base_ptr)((undefined8 *)CONCAT44(extraout_var_00,iVar3))[1];
  local_b0 = (_Base_ptr)&this->globalExit;
  local_a8 = (_Base_ptr)&this->globalMain;
  do {
    if (__str == local_98) {
      return;
    }
    std::__cxx11::string::string
              ((string *)&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    CreateTestFunc((TestRunner *)local_d0,&local_70);
    uVar1 = local_d0._0_8_;
    if ((TestFunc *)local_d0._0_8_ != (TestFunc *)0x0) {
      std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x10),
                 (__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> *)local_a0);
      std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> *)(uVar1 + 0x78),
                 (__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x18));
      std::__cxx11::string::string((string *)&local_90,(string *)(local_d0._0_8_ + 0x20));
      gnilk::Log::Info<char_const*,char_const*,char_const*,char_const*>
                (this->pLogger,"  Module: %s, case: %s, Symbol: %s",
                 (((string *)(local_d0._0_8_ + 0x20))->_M_dataplus)._M_p,
                 (((string *)(local_d0._0_8_ + 0x40))->_M_dataplus)._M_p,local_70._M_dataplus._M_p);
      bVar2 = std::operator==(&local_90,"-");
      if (bVar2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_90,(string *)(local_d0._0_8_ + 0x40));
      }
      bVar2 = TestFunc::IsGlobalMain((TestFunc *)local_d0._0_8_);
      if (bVar2) {
        *(kTestScope *)(local_d0._0_8_ + 0x68) = kGlobal;
        this_01 = local_a8;
LAB_0017fc6b:
        std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)this_01,
                   (__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
      }
      else {
        bVar2 = TestFunc::IsGlobalExit((TestFunc *)local_d0._0_8_);
        if (bVar2) {
          *(kTestScope *)(local_d0._0_8_ + 0x68) = kGlobal;
          this_01 = local_b0;
          goto LAB_0017fc6b;
        }
        GetOrAddModule((TestRunner *)(local_d0 + 0x10),(string *)this);
        bVar2 = TestFunc::IsGlobal((TestFunc *)local_d0._0_8_);
        if (bVar2) {
          *(kTestScope *)(local_d0._0_8_ + 0x68) = kModuleMain;
          this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d0._16_8_ + 0x80);
LAB_0017fcd3:
          std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)this_02,
                     (__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
        }
        else {
          bVar2 = TestFunc::IsModuleExit((TestFunc *)local_d0._0_8_);
          if (bVar2) {
            *(kTestScope *)(local_d0._0_8_ + 0x68) = kModuleExit;
            this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d0._16_8_ + 0x90);
            goto LAB_0017fcd3;
          }
          GetOrAddModule((TestRunner *)local_50,(string *)this);
          std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 0x10)
                     ,(__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)local_50);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
          *(kTestScope *)(local_d0._0_8_ + 0x68) = kModuleCase;
          TestModule::AddTestFunc((TestModule *)local_d0._16_8_,(Ref *)local_d0);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
      }
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
    std::__cxx11::string::~string((string *)&local_70);
    __str = __str + 1;
  } while( true );
}

Assistant:

void TestRunner::PrepareTests() {

    pLogger->Info("Prepare tests in library: %s (%s)", library->Name().c_str(), library->GetVersion().AsString().c_str());
    for(auto x:library->Exports()) {

        TestFunc::Ref func = CreateTestFunc(x);
        if (func == nullptr) {
            continue;
        }

        func->SetLibrary(library);

        std::string moduleName = func->ModuleName();
        pLogger->Info("  Module: %s, case: %s, Symbol: %s", func->ModuleName().c_str(), func->CaseName().c_str(), x.c_str());

        // Ok, this is the signature of the main function for a 'library' (group of functions)
        if (moduleName == "-") {
            moduleName = func->CaseName();
        }

        // Identify the symbol/pattern and assign it properly
        // The 'TestScope' is a simplification for later
        if (func->IsGlobalMain()) {
            func->SetTestScope(TestFunc::kTestScope::kGlobal);
            globalMain = func;
        } else if (func->IsGlobalExit()) {
            func->SetTestScope(TestFunc::kTestScope::kGlobal);
            globalExit = func;
        } else {
            // These are module functions - and handled differently and with lower priority
            // Note: the 'GetOrAdd' module will create a module if not found...
            auto tModule = GetOrAddModule(moduleName);
            if (func->IsGlobal()) {
                func->SetTestScope(TestFunc::kTestScope::kModuleMain);
                tModule->mainFunc = func;
            } else if (func->IsModuleExit()) {
                func->SetTestScope(TestFunc::kTestScope::kModuleExit);
                tModule->exitFunc = func;
            } else {
                tModule = GetOrAddModule(moduleName);
                func->SetTestScope(TestFunc::kTestScope::kModuleCase);
                tModule->AddTestFunc(func);
            }
        }
    }
    // Note: We can't resolve dependencies here as they are configured during module main
}